

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O0

void addEdgesFromNotMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  bool bVar1;
  element_type *peVar2;
  reference pCVar3;
  reference pbVar4;
  byte local_1ab;
  string local_1a8 [32];
  string local_188 [39];
  byte local_161;
  string local_160 [39];
  byte local_139;
  string local_138 [32];
  string local_118 [8];
  string out;
  undefined1 local_f8 [8];
  string def;
  CTemp local_d8;
  string local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  _Self local_98;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_70 [8];
  CTemp defTemp;
  iterator __end1;
  iterator __begin1;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ignoreList_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *graph_local;
  CodeLine *line_local;
  
  peVar2 = std::
           __shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)line);
  (*peVar2->_vptr_AssemblyCommand[1])(&__begin1);
  __end1 = std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::begin
                     ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin1);
  defTemp._24_8_ =
       std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::end
                 ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
                                     *)&defTemp.field_0x18), bVar1) {
    pCVar3 = __gnu_cxx::
             __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
             ::operator*(&__end1);
    IRT::CTemp::CTemp((CTemp *)local_70,pCVar3);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&line->liveOutTemps);
    local_98._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&line->liveOutTemps);
    while (bVar1 = std::operator!=(&__end2,&local_98), bVar1) {
      pbVar4 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string(local_b8,(string *)pbVar4);
      IRT::CTemp::ToString_abi_cxx11_(&local_d8);
      bVar1 = std::operator!=(&local_d8.name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      if (bVar1) {
        IRT::CTemp::ToString_abi_cxx11_((CTemp *)local_f8);
        std::__cxx11::string::string(local_118,local_b8);
        local_139 = 0;
        local_161 = 0;
        bVar1 = isInIgnoreList((string *)local_f8);
        local_1ab = 0;
        if (!bVar1) {
          bVar1 = isInIgnoreList((string *)local_118);
          local_1ab = 0;
          if (!bVar1) {
            std::__cxx11::string::string(local_138,(string *)local_f8);
            local_139 = 1;
            bVar1 = isInDynamicIgnoreList((string *)local_138,ignoreList);
            local_1ab = 0;
            if (!bVar1) {
              std::__cxx11::string::string(local_160,local_118);
              local_161 = 1;
              bVar1 = isInDynamicIgnoreList((string *)local_160,ignoreList);
              local_1ab = bVar1 ^ 0xff;
            }
          }
        }
        if ((local_161 & 1) != 0) {
          std::__cxx11::string::~string(local_160);
        }
        if ((local_139 & 1) != 0) {
          std::__cxx11::string::~string(local_138);
        }
        if ((local_1ab & 1) != 0) {
          std::__cxx11::string::string(local_188,(string *)local_f8);
          std::__cxx11::string::string(local_1a8,local_118);
          AssemblyCode::addNotOrientedEdge((string *)local_188,(string *)local_1a8,graph);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string(local_188);
        }
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string((string *)local_f8);
      }
      std::__cxx11::string::~string(local_b8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    IRT::CTemp::~CTemp((CTemp *)local_70);
    __gnu_cxx::
    __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>::
    operator++(&__end1);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
            ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&__begin1);
  return;
}

Assistant:

void addEdgesFromNotMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                             std::vector<std::string>& ignoreList) {
    for (auto defTemp : line.command->GetOut()) {
        for (auto outTemp : line.liveOutTemps) {
            if (defTemp.ToString() != outTemp) {
                std::string def = defTemp.ToString( );
                std::string out = outTemp;
                if ( !isInIgnoreList( def ) && !isInIgnoreList( out ) && !isInDynamicIgnoreList(def, ignoreList) && !isInDynamicIgnoreList(out, ignoreList)) {
                    AssemblyCode::addNotOrientedEdge( def, out, graph );
                }
            }
        }
    }
}